

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<capnp::compiler::Resolver::ResolvedDecl> * __thiscall
capnp::compiler::Compiler::Node::getParent
          (Maybe<capnp::compiler::Resolver::ResolvedDecl> *__return_storage_ptr__,Node *this)

{
  Which WVar1;
  uint uVar2;
  Node *pNVar3;
  Node *pNVar4;
  uint64_t uVar5;
  Maybe<capnp::compiler::Resolver::ResolvedDecl> *pMVar6;
  uint64_t uVar7;
  
  pMVar6 = __return_storage_ptr__;
  pNVar3 = (this->parent).ptr;
  if (pNVar3 != (Node *)0x0) {
    pNVar4 = (pNVar3->parent).ptr;
    if (pNVar4 == (Node *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = pNVar4->id;
    }
    uVar5 = pNVar3->id;
    uVar2 = pNVar3->genericParamCount;
    WVar1 = pNVar3->kind;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.id = uVar5;
    (__return_storage_ptr__->ptr).field_1.value.genericParamCount = uVar2;
    (__return_storage_ptr__->ptr).field_1.value.scopeId = uVar7;
    (__return_storage_ptr__->ptr).field_1.value.kind = WVar1;
    (__return_storage_ptr__->ptr).field_1.value.resolver = &pNVar3->super_Resolver;
    __return_storage_ptr__ =
         (Maybe<capnp::compiler::Resolver::ResolvedDecl> *)
         &(__return_storage_ptr__->ptr).field_1.value.brand;
  }
  ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)
  &((Maybe<capnp::schema::Brand::Reader> *)__return_storage_ptr__)->ptr)->isSet = false;
  return pMVar6;
}

Assistant:

kj::Maybe<Resolver::ResolvedDecl> Compiler::Node::getParent() {
  return parent.map([](Node& parent) {
    uint64_t scopeId = parent.parent.map([](Node& gp) { return gp.id; }).orDefault(0);
    return ResolvedDecl { parent.id, parent.genericParamCount, scopeId, parent.kind, &parent, kj::none };
  });
}